

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading-c.cpp
# Opt level: O1

duckdb_task_state duckdb_create_task_state(duckdb_database database)

{
  undefined8 *puVar1;
  DuckDB *this;
  type pDVar2;
  undefined1 *puVar3;
  
  if (database == (duckdb_database)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    puVar1 = (undefined8 *)operator_new(0x18);
    this = duckdb::shared_ptr<duckdb::DuckDB,_true>::operator->
                     ((shared_ptr<duckdb::DuckDB,_true> *)database);
    pDVar2 = duckdb::shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->instance);
    *puVar1 = pDVar2;
    puVar3 = (undefined1 *)operator_new(1);
    *puVar3 = 1;
    puVar1[1] = puVar3;
    puVar1[2] = 0;
  }
  return puVar1;
}

Assistant:

duckdb_task_state duckdb_create_task_state(duckdb_database database) {
	if (!database) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<DatabaseWrapper *>(database);
	auto state = new CAPITaskState(*wrapper->database->instance);
	return state;
}